

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O1

bool __thiscall
duckdb::UhugeintToDecimalCast<short>
          (duckdb *this,uhugeint_t input,short *result,CastParameters *parameters,uint8_t width,
          uint8_t scale)

{
  bool bVar1;
  int16_t *result_00;
  uchar params_2;
  undefined3 in_register_00000089;
  uint uVar2;
  uint uVar3;
  uhugeint_t uVar4;
  uhugeint_t input_00;
  string error;
  uhugeint_t max_width;
  uhugeint_t local_b8;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  uhugeint_t local_48;
  
  uVar2 = CONCAT31(in_register_00000089,width);
  local_b8.upper = input.lower;
  result_00 = (int16_t *)((((ulong)parameters & 0xffffffff) - (ulong)uVar2) * 0x10);
  local_48.lower = *(uint64_t *)(result_00 + 0xcf6570);
  local_48.upper = *(uint64_t *)(result_00 + 0xcf6574);
  uVar3 = uVar2;
  local_b8.lower = (uint64_t)this;
  bVar1 = uhugeint_t::operator>=(&local_b8,&local_48);
  params_2 = (uchar)uVar3;
  if (bVar1) {
    local_a8[0] = local_98;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_a8,"Could not cast value %s to DECIMAL(%d,%d)","");
    uhugeint_t::ToString_abi_cxx11_(&local_68,&local_b8);
    StringUtil::Format<std::__cxx11::string,unsigned_char,unsigned_char>
              (&local_88,(StringUtil *)local_a8,&local_68,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((ulong)parameters & 0xff),width,params_2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_a8[0] != local_98) {
      operator_delete(local_a8[0]);
    }
    HandleCastError::AssignError(&local_88,(CastParameters *)result);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT62(local_88._M_dataplus._M_p._2_6_,local_88._M_dataplus._M_p._0_2_) !=
        &local_88.field_2) {
      operator_delete((undefined1 *)
                      CONCAT62(local_88._M_dataplus._M_p._2_6_,local_88._M_dataplus._M_p._0_2_));
    }
  }
  else {
    uVar4 = uhugeint_t::operator*(&local_b8,(uhugeint_t *)(Uhugeint::POWERS_OF_TEN + (uVar2 << 4)));
    local_88._M_dataplus._M_p._0_2_ = 0;
    input_00.upper = (uint64_t)&local_88;
    input_00.lower = uVar4.upper;
    Uhugeint::TryCast<short>((Uhugeint *)uVar4.lower,input_00,result_00);
    *(undefined2 *)input.upper = local_88._M_dataplus._M_p._0_2_;
  }
  return !bVar1;
}

Assistant:

bool UhugeintToDecimalCast(uhugeint_t input, DST &result, CastParameters &parameters, uint8_t width, uint8_t scale) {
	// check for overflow
	uhugeint_t max_width = Uhugeint::POWERS_OF_TEN[width - scale];
	if (input >= max_width) {
		string error = StringUtil::Format("Could not cast value %s to DECIMAL(%d,%d)", input.ToString(), width, scale);
		HandleCastError::AssignError(error, parameters);
		return false;
	}
	result = Uhugeint::Cast<DST>(input * Uhugeint::POWERS_OF_TEN[scale]);
	return true;
}